

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O0

void __thiscall QColor::setRgb(QColor *this,QRgb rgb)

{
  int iVar1;
  QRgb in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = 1;
  *(undefined2 *)(in_RDI + 1) = 0xffff;
  iVar1 = qRed(in_ESI);
  *(short *)((long)in_RDI + 6) = (short)iVar1 * 0x101;
  iVar1 = qGreen(in_ESI);
  *(short *)(in_RDI + 2) = (short)iVar1 * 0x101;
  iVar1 = qBlue(in_ESI);
  *(short *)((long)in_RDI + 10) = (short)iVar1 * 0x101;
  *(undefined2 *)(in_RDI + 3) = 0;
  return;
}

Assistant:

void QColor::setRgb(QRgb rgb) noexcept
{
    cspec = Rgb;
    ct.argb.alpha = 0xffff;
    ct.argb.red   = qRed(rgb)   * 0x101;
    ct.argb.green = qGreen(rgb) * 0x101;
    ct.argb.blue  = qBlue(rgb)  * 0x101;
    ct.argb.pad   = 0;
}